

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

optional<std::pair<const_char_*,_unsigned_long>_> * __thiscall
std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::operator=
          (optional<std::pair<const_char_*,_unsigned_long>_> *this,
          optional<std::pair<const_char_*,_unsigned_long>_> *rhs)

{
  bool bVar1;
  pair<const_char_*,_unsigned_long> *ppVar2;
  pair<const_char_*,_unsigned_long> *this_00;
  optional<std::pair<const_char_*,_unsigned_long>_> *rhs_local;
  optional<std::pair<const_char_*,_unsigned_long>_> *this_local;
  
  bVar1 = initialized(this);
  if ((!bVar1) || (bVar1 = initialized(rhs), bVar1)) {
    bVar1 = initialized(this);
    if ((bVar1) || (bVar1 = initialized(rhs), !bVar1)) {
      bVar1 = initialized(this);
      if ((bVar1) && (bVar1 = initialized(rhs), bVar1)) {
        ppVar2 = operator*(rhs);
        this_00 = contained_val(this);
        pair<const_char_*,_unsigned_long>::operator=(this_00,ppVar2);
      }
    }
    else {
      ppVar2 = operator*(rhs);
      optional<std::pair<char_const*,unsigned_long>>::
      initialize<std::pair<char_const*,unsigned_long>>
                ((optional<std::pair<char_const*,unsigned_long>> *)this,ppVar2);
    }
  }
  else {
    clear(this);
  }
  return this;
}

Assistant:

optional& operator=(optional&& rhs)
  noexcept(is_nothrow_move_assignable<T>::value && is_nothrow_move_constructible<T>::value)
  {
    if      (initialized() == true  && rhs.initialized() == false) clear();
    else if (initialized() == false && rhs.initialized() == true)  initialize(std::move(*rhs));
    else if (initialized() == true  && rhs.initialized() == true)  contained_val() = std::move(*rhs);
    return *this;
  }